

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O0

string * google::protobuf::(anonymous_namespace)::GetTemporaryDirectoryName_abi_cxx11_(void)

{
  string *in_RDI;
  AlphaNum *in_R8;
  AlphaNum local_d8;
  AlphaNum local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  AlphaNum local_48;
  undefined1 local_15;
  __pid_t local_14;
  int pid;
  string *result;
  
  local_14 = getpid();
  local_15 = 0;
  testing::TempDir_abi_cxx11_();
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_48,&local_68);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_a8,"protobuf_tempdir.");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,local_14);
  absl::lts_20250127::StrCat_abi_cxx11_(in_RDI,(lts_20250127 *)&local_48,&local_a8,&local_d8,in_R8);
  std::__cxx11::string::~string((string *)&local_68);
  return in_RDI;
}

Assistant:

std::string GetTemporaryDirectoryName() {
#ifdef _WIN32
  DWORD pid = GetCurrentProcessId();
#else
  int pid = getpid();
#endif
  std::string result = absl::StrCat(testing::TempDir(), "protobuf_tempdir.", pid);
#ifdef _WIN32
  // The Win32 API accepts forward slashes as a path delimiter as long as the
  // path doesn't use the "\\?\" prefix.
  // Let's avoid confusion and use only forward slashes.
  result = absl::StrReplaceAll(result, {{"\\", "/"}});
#endif  // _WIN32
  return result;
}